

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

void __thiscall
GeneratorProfile_defaultPiecewiseStatementValues_Test::TestBody
          (GeneratorProfile_defaultPiecewiseStatementValues_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  GeneratorProfilePtr generatorProfile;
  AssertHelper local_58 [8];
  long *local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::GeneratorProfile::create((Profile)local_20);
  libcellml::GeneratorProfile::conditionalOperatorIfString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            ((internal *)&local_50,"\"([CONDITION])?[IF_STATEMENT]\"",
             "generatorProfile->conditionalOperatorIfString()",
             (char (*) [29])"([CONDITION])?[IF_STATEMENT]",&local_40);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::conditionalOperatorElseString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[18],std::__cxx11::string>
            ((internal *)&local_50,"\":[ELSE_STATEMENT]\"",
             "generatorProfile->conditionalOperatorElseString()",(char (*) [18])":[ELSE_STATEMENT]",
             &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::piecewiseIfString_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_50,"\"\"","generatorProfile->piecewiseIfString()",
             (char (*) [1])0x16dcbb,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::piecewiseElseString_abi_cxx11_();
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_50,"\"\"","generatorProfile->piecewiseElseString()",
             (char (*) [1])0x16dcbb,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_40._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50 = (long *)CONCAT71(local_50._1_7_,1);
  local_58[0] = (AssertHelper)libcellml::GeneratorProfile::hasConditionalOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_40,"true","generatorProfile->hasConditionalOperator()",
             (bool *)&local_50,(bool *)local_58);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if (local_50 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_50 != (long *)0x0)) {
        (**(code **)(*local_50 + 8))();
      }
      local_50 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(GeneratorProfile, defaultPiecewiseStatementValues)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    EXPECT_EQ("([CONDITION])?[IF_STATEMENT]", generatorProfile->conditionalOperatorIfString());
    EXPECT_EQ(":[ELSE_STATEMENT]", generatorProfile->conditionalOperatorElseString());
    EXPECT_EQ("", generatorProfile->piecewiseIfString());
    EXPECT_EQ("", generatorProfile->piecewiseElseString());

    EXPECT_EQ(true, generatorProfile->hasConditionalOperator());
}